

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O0

size_t bignParamsGen_deep(size_t n)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t m;
  size_t sVar5;
  long in_RDI;
  size_t in_stack_ffffffffffffffe0;
  
  sVar1 = beltHash_keep();
  sVar1 = in_RDI * 0x20 + 8 + sVar1;
  sVar2 = beltHash_keep();
  sVar3 = priIsPrime_deep(0x16230a);
  sVar4 = ecpDetIsZero_deep(in_stack_ffffffffffffffe0);
  m = ecpMOVIsMet_deep(sVar2);
  sVar5 = zzPowerMod_deep(sVar1,m);
  sVar2 = utilMax(5,sVar2,sVar3,sVar4,m,sVar5);
  return sVar1 + sVar2;
}

Assistant:

static size_t bignParamsGen_deep(size_t n)
{
	return O_OF_W(4 * n) + 8 + beltHash_keep() + 
		utilMax(5,
			beltHash_keep(),
			priIsPrime_deep(n),
			ecpDetIsZero_deep(n),
			ecpMOVIsMet_deep(n),
			zzPowerMod_deep(n, n)
		);
}